

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_blur_geometry_device.cpp
# Opt level: O1

uint embree::addTriangleCube(RTCScene scene,Vec3fa *pos,uint num_time_steps)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar30 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  Vector u;
  
  uVar12 = 0;
  uVar9 = rtcNewGeometry(g_device,0);
  rtcSetGeometryTimeStepCount(uVar9,num_time_steps);
  rtcSetSharedGeometryBuffer(uVar9,0,0,0x5003,data._136_8_,0,0xc,0xc);
  if (num_time_steps != 0) {
    auVar30._0_12_ = ZEXT812(0x3f800000);
    auVar30._12_4_ = 0;
    auVar30 = rsqrtss(auVar30,ZEXT816(0x3f800000));
    fVar24 = auVar30._0_4_;
    fVar24 = fVar24 * fVar24 * fVar24 * -0.5 + fVar24 * 1.5;
    fVar25 = fVar24 * 0.0;
    fVar31 = fVar24 * 1.0;
    fVar24 = fVar24 * 0.0;
    do {
      lVar10 = rtcSetNewGeometryBuffer(uVar9,1,uVar12,0x9003,0x10,8);
      fVar13 = ((float)uVar12 * 6.2831855) / (float)(num_time_steps - 1);
      fVar14 = sinf(fVar13);
      fVar13 = cosf(fVar13);
      fVar26 = 1.0 - fVar13;
      fVar47 = fVar25 * fVar31 * fVar26;
      fVar19 = fVar47 - fVar14 * fVar24;
      fVar38 = fVar25 * fVar24 * fVar26;
      fVar15 = fVar38 + fVar14 * fVar31;
      fVar47 = fVar14 * fVar24 + fVar47;
      fVar26 = fVar31 * fVar24 * fVar26;
      fVar27 = fVar26 - fVar14 * fVar25;
      fVar38 = fVar38 - fVar14 * fVar31;
      fVar26 = fVar14 * fVar25 + fVar26;
      fVar48 = (1.0 - fVar24 * fVar24) * fVar13 + fVar24 * fVar24;
      fVar14 = fVar13 * (1.0 - fVar25 * fVar25) + fVar25 * fVar25;
      fVar39 = fVar14 * 1.0 + fVar47 * 0.0 + fVar38 * 0.0;
      fVar40 = fVar14 * 0.0 + fVar47 * 1.0 + fVar38 * 0.0;
      fVar41 = fVar14 * 0.0 + fVar47 * 0.0 + fVar38 * 1.0;
      fVar42 = fVar14 * 0.0 + fVar47 * 0.0 + fVar38 * 0.0;
      fVar13 = (1.0 - fVar31 * fVar31) * fVar13 + fVar31 * fVar31;
      fVar20 = fVar19 * 1.0 + fVar13 * 0.0 + fVar26 * 0.0;
      fVar21 = fVar19 * 0.0 + fVar13 * 1.0 + fVar26 * 0.0;
      fVar22 = fVar19 * 0.0 + fVar13 * 0.0 + fVar26 * 1.0;
      fVar23 = fVar19 * 0.0 + fVar13 * 0.0 + fVar26 * 0.0;
      fVar14 = fVar15 * 1.0 + fVar27 * 0.0 + fVar48 * 0.0;
      fVar19 = fVar15 * 0.0 + fVar27 * 1.0 + fVar48 * 0.0;
      fVar38 = fVar15 * 0.0 + fVar27 * 0.0 + fVar48 * 1.0;
      fVar47 = fVar15 * 0.0 + fVar27 * 0.0 + fVar48 * 0.0;
      fVar28 = fVar14 * 0.0;
      fVar32 = fVar19 * 0.0;
      fVar34 = fVar38 * 0.0;
      fVar36 = fVar47 * 0.0;
      fVar13 = fVar20 * 0.0 + fVar28 + fVar39;
      fVar15 = fVar21 * 0.0 + fVar32 + fVar40;
      fVar26 = fVar22 * 0.0 + fVar34 + fVar41;
      fVar27 = fVar23 * 0.0 + fVar36 + fVar42;
      fVar39 = fVar39 * 0.0;
      fVar40 = fVar40 * 0.0;
      fVar41 = fVar41 * 0.0;
      fVar42 = fVar42 * 0.0;
      fVar43 = fVar20 + fVar28 + fVar39;
      fVar44 = fVar21 + fVar32 + fVar40;
      fVar45 = fVar22 + fVar34 + fVar41;
      fVar46 = fVar23 + fVar36 + fVar42;
      fVar48 = fVar14 + fVar20 * 0.0 + fVar39;
      fVar16 = fVar19 + fVar21 * 0.0 + fVar40;
      fVar17 = fVar38 + fVar22 * 0.0 + fVar41;
      fVar18 = fVar47 + fVar23 * 0.0 + fVar42;
      fVar29 = fVar48 * 0.0;
      fVar33 = fVar16 * 0.0;
      fVar35 = fVar17 * 0.0;
      fVar37 = fVar18 * 0.0;
      fVar49 = fVar43 * 0.0;
      fVar51 = fVar44 * 0.0;
      fVar53 = fVar45 * 0.0;
      fVar55 = fVar46 * 0.0;
      fVar50 = fVar49 + fVar29;
      fVar52 = fVar51 + fVar33;
      fVar54 = fVar53 + fVar35;
      fVar56 = fVar55 + fVar37;
      fVar14 = fVar13 * 0.0;
      fVar19 = fVar15 * 0.0;
      fVar38 = fVar26 * 0.0;
      fVar47 = fVar27 * 0.0;
      lVar11 = 0;
      do {
        fVar2 = *(float *)((long)&cube_vertices + lVar11);
        fVar3 = *(float *)((long)&DAT_002d2034 + lVar11);
        fVar4 = *(float *)((long)&DAT_002d2038 + lVar11);
        fVar5 = (pos->field_0).m128[1];
        fVar6 = (pos->field_0).m128[2];
        fVar7 = (pos->field_0).m128[3];
        pfVar1 = (float *)(lVar10 + lVar11);
        *pfVar1 = fVar4 * (fVar48 + fVar49 + fVar14) +
                  fVar14 + fVar50 + ((fVar20 * -0.0 - fVar28) - fVar39) + 0.0 +
                  fVar3 * (fVar29 + fVar43 + fVar14) + fVar2 * (fVar13 + fVar13 + fVar50) +
                  (pos->field_0).m128[0];
        pfVar1[1] = fVar4 * (fVar16 + fVar51 + fVar19) +
                    fVar19 + fVar52 + ((fVar21 * -0.0 - fVar32) - fVar40) + 0.0 +
                    fVar3 * (fVar33 + fVar44 + fVar19) + fVar2 * (fVar15 + fVar15 + fVar52) + fVar5;
        pfVar1[2] = fVar4 * (fVar17 + fVar53 + fVar38) +
                    fVar38 + fVar54 + ((fVar22 * -0.0 - fVar34) - fVar41) + 0.0 +
                    fVar3 * (fVar35 + fVar45 + fVar38) + fVar2 * (fVar26 + fVar26 + fVar54) + fVar6;
        pfVar1[3] = fVar4 * (fVar18 + fVar55 + fVar47) +
                    fVar47 + fVar56 + ((fVar23 * -0.0 - fVar36) - fVar42) + 0.0 +
                    fVar3 * (fVar37 + fVar46 + fVar47) + fVar2 * (fVar27 + fVar27 + fVar56) + fVar7;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x80);
      uVar12 = uVar12 + 1;
    } while (uVar12 != num_time_steps);
  }
  uVar8 = data._24_8_;
  *(undefined8 *)data._24_8_ = 0x3f800000;
  *(undefined8 *)(uVar8 + 8) = 0;
  uVar8 = data._24_8_;
  *(undefined8 *)(data._24_8_ + 0x10) = 0x3f800000;
  *(undefined8 *)(uVar8 + 0x18) = 0;
  uVar8 = data._24_8_;
  *(undefined8 *)(data._24_8_ + 0x20) = 0x3f80000000000000;
  *(undefined8 *)(uVar8 + 0x28) = 0;
  *(undefined8 *)(uVar8 + 0x30) = 0x3f80000000000000;
  *(undefined8 *)(uVar8 + 0x38) = 0;
  *(undefined8 *)(uVar8 + 0x40) = 0x3f0000003f000000;
  *(undefined8 *)(uVar8 + 0x48) = 0x3f0000003f000000;
  *(undefined8 *)(uVar8 + 0x50) = 0x3f0000003f000000;
  *(undefined8 *)(uVar8 + 0x58) = 0x3f0000003f000000;
  *(undefined8 *)(uVar8 + 0x60) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0x68) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0x70) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0x78) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0x80) = 0;
  *(undefined8 *)(uVar8 + 0x88) = 0x3f800000;
  *(undefined8 *)(uVar8 + 0x90) = 0;
  *(undefined8 *)(uVar8 + 0x98) = 0x3f800000;
  *(undefined8 *)(uVar8 + 0xa0) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0xa8) = 0;
  *(undefined8 *)(uVar8 + 0xb0) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0xb8) = 0;
  rtcCommitGeometry(uVar9);
  uVar12 = rtcAttachGeometry(scene,uVar9);
  rtcReleaseGeometry(uVar9);
  return uVar12;
}

Assistant:

unsigned int addTriangleCube (RTCScene scene, const Vec3fa& pos, unsigned int num_time_steps)
{
  /* create a triangulated cube with 12 triangles and 8 vertices */
  RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  rtcSetGeometryTimeStepCount(geom,num_time_steps);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT3, data.cube_triangle_indices, 0, 3*sizeof(unsigned int), 12);

  for (unsigned int t=0; t<num_time_steps; t++)
  {
    RTCBufferType bufType = RTC_BUFFER_TYPE_VERTEX;
    Vec3fa* vertices = (Vec3fa*) rtcSetNewGeometryBuffer(geom,bufType,t,RTC_FORMAT_FLOAT3,sizeof(Vec3fa), 8);

    AffineSpace3fa rotation = AffineSpace3fa::rotate(Vec3fa(0,0,0),Vec3fa(0,1,0),2.0f*float(M_PI)*(float)t/(float)(num_time_steps-1));
    AffineSpace3fa scale = AffineSpace3fa::scale(Vec3fa(2.0f,1.0f,1.0f));

    for (int i=0; i<8; i++) {
      Vec3fa v = Vec3fa(cube_vertices[i][0],cube_vertices[i][1],cube_vertices[i][2]);
      vertices[i] = Vec3fa(xfmPoint(rotation*scale,v)+pos);
    }
  }

  /* create face color array */
  data.face_colors[0] = Vec3fa(1,0,0);
  data.face_colors[1] = Vec3fa(1,0,0);
  data.face_colors[2] = Vec3fa(0,1,0);
  data.face_colors[3] = Vec3fa(0,1,0);
  data.face_colors[4] = Vec3fa(0.5f);
  data.face_colors[5] = Vec3fa(0.5f);
  data.face_colors[6] = Vec3fa(1.0f);
  data.face_colors[7] = Vec3fa(1.0f);
  data.face_colors[8] = Vec3fa(0,0,1);
  data.face_colors[9] = Vec3fa(0,0,1);
  data.face_colors[10] = Vec3fa(1,1,0);
  data.face_colors[11] = Vec3fa(1,1,0);

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
  return geomID;
}